

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

Snapshot * __thiscall
cmState::CreateCallStackSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine,string *fileName)

{
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar1;
  cmLinkedTree<cmDefinitions> *pcVar2;
  PositionType PVar3;
  PositionType it;
  cmState *pcVar4;
  ReferenceType __src;
  PointerType pSVar5;
  PointerType pBVar6;
  PointerType pSVar7;
  iterator iVar8;
  iterator local_170;
  Snapshot *local_160;
  long local_158;
  string *local_150;
  string *local_148;
  cmState *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [168];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  size_type sStack_48;
  size_type local_40;
  size_type sStack_38;
  
  it = originSnapshot.Position;
  local_160 = __return_storage_ptr__;
  local_158 = entryPointLine;
  local_150 = entryPointCommand;
  local_148 = fileName;
  local_140 = this;
  __src = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  memcpy((SnapshotDataType *)local_118,__src,0xa8);
  pcVar1 = (__src->EntryPointCommand)._M_dataplus._M_p;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (__src->EntryPointCommand)._M_string_length);
  local_50 = __src->EntryPointLine;
  sStack_48 = __src->IncludeDirectoryPosition;
  local_40 = __src->CompileDefinitionsPosition;
  sStack_38 = __src->CompileOptionsPosition;
  local_170 = cmLinkedTree<cmState::SnapshotDataType>::Push
                        (&this->SnapshotData,it,(SnapshotDataType *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pSVar5->EntryPointLine = local_158;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  std::__cxx11::string::_M_assign((string *)&pSVar5->EntryPointCommand);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pSVar5->SnapshotType = CallStackType;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pcVar4 = local_140;
  pSVar5->Keep = true;
  this_00 = &local_140->ExecutionListFiles;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  iVar8 = pSVar5->ExecutionListFile;
  pcVar1 = (local_148->_M_dataplus)._M_p;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar1,pcVar1 + local_148->_M_string_length);
  iVar8 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push(this_00,iVar8,&local_138);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
  pSVar5->ExecutionListFile = iVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pcVar2 = (pSVar5->Vars).Tree;
  if ((pcVar2 != (cmLinkedTree<cmDefinitions> *)0x0) &&
     ((pSVar5->Vars).Position <=
      (ulong)(((long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
    pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
    pBVar6 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar5->BuildSystemDirectory);
    (pBVar6->DirectoryEnd).Tree = local_170.Tree;
    (pBVar6->DirectoryEnd).Position = local_170.Position;
    pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position)
    ;
    pSVar7 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_170);
    PVar3 = (pSVar5->Policies).Position;
    (pSVar7->PolicyScope).Tree = (pSVar5->Policies).Tree;
    (pSVar7->PolicyScope).Position = PVar3;
    local_160->State = pcVar4;
    (local_160->Position).Tree = local_170.Tree;
    (local_160->Position).Position = local_170.Position;
    return local_160;
  }
  __assert_fail("originSnapshot.Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                ,0x3b3,
                "cmState::Snapshot cmState::CreateCallStackSnapshot(cmState::Snapshot, const std::string &, long, const std::string &)"
               );
}

Assistant:

cmState::Snapshot
cmState::CreateCallStackSnapshot(cmState::Snapshot originSnapshot,
                                 const std::string& entryPointCommand,
                                 long entryPointLine,
                                 const std::string& fileName)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->SnapshotType = CallStackType;
  pos->Keep = true;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
        originSnapshot.Position->ExecutionListFile, fileName);
  assert(originSnapshot.Position->Vars.IsValid());
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmState::Snapshot(this, pos);
}